

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

EncodingType httplib::detail::encoding_type(Request *req,Response *res)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  char *pcVar5;
  bool bVar6;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar7;
  allocator local_69;
  key_type local_68;
  long *local_48;
  size_t local_40;
  long local_38 [2];
  
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Content-Type","");
  pVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::equal_range(&(res->headers)._M_t,&local_68);
  if (pVar7.first._M_node._M_node == pVar7.second._M_node._M_node) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)(pVar7.first._M_node._M_node + 2);
  }
  std::__cxx11::string::string((string *)&local_48,pcVar5,&local_69);
  uVar2 = str2tag_core((char *)local_48,local_40,0);
  bVar6 = true;
  if ((int)uVar2 < 0x2348aed) {
    if (((uVar2 == 0xcb462) || (uVar2 == 0x1accd8)) || (uVar2 == 0xa74526)) goto LAB_00151629;
  }
  else if (((uVar2 == 0x2348aed) || (uVar2 == 0x2bb6a6c)) || (uVar2 == 0x2c726b2))
  goto LAB_00151629;
  bVar6 = false;
  lVar4 = std::__cxx11::string::rfind((char *)&local_48,0x16901b,0);
  if (lVar4 == 0) {
    uVar3 = str2tag_core("text/event-stream",0x11,0);
    bVar6 = uVar2 != uVar3;
  }
LAB_00151629:
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (bVar6) {
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Accept-Encoding","");
    pVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::equal_range(&(req->headers)._M_t,&local_68);
    if (pVar7.first._M_node._M_node == pVar7.second._M_node._M_node) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)(pVar7.first._M_node._M_node + 2);
    }
    std::__cxx11::string::string((string *)&local_48,pcVar5,&local_69);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
  }
  return None;
}

Assistant:

inline EncodingType encoding_type(const Request &req, const Response &res) {
  auto ret =
      detail::can_compress_content_type(res.get_header_value("Content-Type"));
  if (!ret) { return EncodingType::None; }

  const auto &s = req.get_header_value("Accept-Encoding");
  (void)(s);

#ifdef CPPHTTPLIB_BROTLI_SUPPORT
  // TODO: 'Accept-Encoding' has br, not br;q=0
  ret = s.find("br") != std::string::npos;
  if (ret) { return EncodingType::Brotli; }
#endif

#ifdef CPPHTTPLIB_ZLIB_SUPPORT
  // TODO: 'Accept-Encoding' has gzip, not gzip;q=0
  ret = s.find("gzip") != std::string::npos;
  if (ret) { return EncodingType::Gzip; }
#endif

  return EncodingType::None;
}